

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

Kit_DsdNtk_t * Kit_DsdNtkAlloc(int nVars)

{
  int iVar1;
  Kit_DsdNtk_t *__s;
  Kit_DsdObj_t **ppKVar2;
  uint *puVar3;
  Kit_DsdNtk_t *pNtk;
  int nVars_local;
  
  __s = (Kit_DsdNtk_t *)malloc(0x20);
  memset(__s,0,0x20);
  ppKVar2 = (Kit_DsdObj_t **)malloc((long)(nVars + 1) << 3);
  __s->pNodes = ppKVar2;
  __s->nVars = (unsigned_short)nVars;
  __s->nNodesAlloc = (unsigned_short)nVars + 1;
  iVar1 = Kit_TruthWordNum(nVars);
  puVar3 = (uint *)malloc((long)(iVar1 * 6) << 2);
  __s->pMem = puVar3;
  return __s;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdNtkAlloc( int nVars )
{
    Kit_DsdNtk_t * pNtk;
    pNtk = ABC_ALLOC( Kit_DsdNtk_t, 1 );
    memset( pNtk, 0, sizeof(Kit_DsdNtk_t) );
    pNtk->pNodes = ABC_ALLOC( Kit_DsdObj_t *, nVars+1 );
    pNtk->nVars = nVars;
    pNtk->nNodesAlloc = nVars+1;
    pNtk->pMem = ABC_ALLOC( unsigned, 6 * Kit_TruthWordNum(nVars) );
    return pNtk;
}